

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_level.c
# Opt level: O1

void prf_push_level_entry_f(prf_node_t *node,prf_state_t *state)

{
  if (node->opcode == prf_push_level_info.opcode) {
    state->push_level = state->push_level + 1;
    return;
  }
  prf_error(9,"tried push level entry state method on node of type %d.");
  return;
}

Assistant:

static
void
prf_push_level_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );
    if ( node->opcode != prf_push_level_info.opcode ) {
        prf_error( 9, "tried push level entry state method on node of type %d.",
            node->opcode );
        return;
    }
    state->push_level++;
}